

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blanczos.cpp
# Opt level: O1

uint32_t blanczos(uint32_t *B,uint64_t N,uint32_t Nrow,uint32_t Ncol,uint64_t *result)

{
  long *plVar1;
  uchar uVar2;
  undefined1 uVar3;
  unsigned_long uVar4;
  byte bVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  pointer puVar12;
  pointer puVar13;
  undefined1 auVar14 [64];
  int iVar15;
  uint32_t nthreads;
  uint uVar16;
  long lVar17;
  result_type rVar18;
  ostream *poVar19;
  ulong uVar20;
  ulong *puVar21;
  pointer puVar22;
  uint uVar23;
  ulong uVar24;
  uint32_t uVar25;
  uint64_t *elem;
  result_type *prVar26;
  ulong uVar27;
  ulong uVar28;
  pointer puVar29;
  uint64_t uVar30;
  ulong uVar31;
  ulong uVar32;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar33;
  uint uVar34;
  void *pvVar35;
  uint32_t vec_1;
  long lVar36;
  unsigned_long *puVar37;
  iterator __begin2;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined8 uVar81;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  vec64 V0;
  vec64 work1;
  vec64 N_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vectors;
  vec64 X;
  vec64 AV0;
  vec64 workV;
  vec64 Q;
  vec64 result_1;
  vec64 work2;
  uniform_int_distribution<unsigned_long> dis;
  sparse matrix;
  arr64 D;
  array<unsigned_int,_64UL> temp;
  arr64 T0;
  arr64 W0i;
  arr64 E;
  arr64 W1i;
  arr64 T1;
  arr64 F;
  arr64 G;
  arr64 W2i;
  mt19937_64 gen;
  random_device rd;
  allocator_type local_32c1;
  void *local_32c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_32b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_32a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3270;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3240;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3228;
  result_type *local_3208;
  result_type *local_3200;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_31f8;
  ulong local_31d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_31d0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_31b8;
  value_type_conflict2 local_31a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3198;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3180;
  undefined1 local_3168 [32];
  uint32_t local_3140;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3138;
  uint64_t *local_3120;
  uniform_int_distribution<unsigned_long> local_3118;
  sparse local_3108;
  arr64 local_3088;
  undefined8 local_2e88;
  undefined8 uStack_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 local_2e68;
  undefined8 uStack_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 local_2e48;
  undefined8 uStack_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 local_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 local_2e08;
  undefined8 uStack_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 local_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 local_2dc8;
  undefined8 uStack_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 local_2da8;
  undefined8 uStack_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  arr64 local_2d80;
  array<unsigned_long,_64UL> local_2b80;
  arr64 local_2980;
  arr64 local_2780;
  array<unsigned_long,_64UL> local_2580;
  array<unsigned_long,_64UL> local_2380;
  arr64 local_2180;
  array<unsigned_long,_64UL> local_1f80;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  undefined1 auVar52 [32];
  undefined1 auVar51 [32];
  undefined1 auVar60 [32];
  undefined1 auVar64 [32];
  undefined1 auVar67 [32];
  undefined1 auVar70 [32];
  undefined1 auVar75 [32];
  undefined1 auVar79 [32];
  undefined1 auVar56 [32];
  
  local_3120 = result;
  iVar15 = std::thread::hardware_concurrency();
  nthreads = iVar15 + (uint)(iVar15 == 0);
  if (Ncol < Nrow + 0x40) {
    poVar19 = std::operator<<((ostream *)&std::cerr,"Ncol >= Nrow + 64 is expected.");
    std::endl<char,std::char_traits<char>>(poVar19);
    exit(0x11);
  }
  __blanczos_matrix::sparse::sparse(&local_3108,B,N,Nrow,Ncol,524288.0);
  do {
    std::random_device::random_device(&local_13b8);
    uVar16 = std::random_device::_M_getval();
    local_1d80._M_x[0] = (unsigned_long)uVar16;
    lVar17 = 1;
    uVar20 = local_1d80._M_x[0];
    do {
      uVar20 = (uVar20 >> 0x3e ^ uVar20) * 0x5851f42d4c957f2d + lVar17;
      local_1d80._M_x[lVar17] = uVar20;
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x138);
    local_1d80._M_p = 0x138;
    local_3118._M_param._M_a = 0;
    local_3118._M_param._M_b = 0xffffffffffffffff;
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_3258,(ulong)local_3108.Kcols,local_2d80._M_elems,(allocator_type *)&local_2580
              );
    puVar22 = local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (prVar26 = local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start; prVar26 != puVar22;
        prVar26 = prVar26 + 1) {
      rVar18 = std::uniform_int_distribution<unsigned_long>::operator()
                         (&local_3118,&local_1d80,&local_3118._M_param);
      *prVar26 = rVar18;
    }
    uVar20 = (ulong)local_3108.Kcols;
    if ((long)local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != uVar20) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"X should have size matrix.Kcol().",0x21);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(0xb);
    }
    local_31d8 = (ulong)local_3108.Ncols;
    uVar31 = (ulong)local_3108.Krows;
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_31b8,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_32b8,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_3228,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_31f8,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_3240,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_3288,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_31d0,uVar20,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_32a0,uVar31,local_2d80._M_elems,(allocator_type *)&local_2580);
    local_2d80._M_elems[0] = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_3180,uVar31,local_2d80._M_elems,(allocator_type *)&local_2580);
    memset(&local_2d80,0,0x200);
    memset((allocator_type *)&local_2580,0,0x200);
    memset(&local_2b80,0,0x200);
    memset(&local_2780,0,0x200);
    memset(&local_1f80,0,0x200);
    memset(&local_2180,0,0x200);
    memset(&local_2380,0,0x200);
    memset(&local_2980,0,0x200);
    memset(&local_3088,0,0x200);
    local_2da8 = 0;
    uStack_2da0 = 0;
    uStack_2d98 = 0;
    uStack_2d90 = 0;
    local_2dc8 = 0;
    uStack_2dc0 = 0;
    uStack_2db8 = 0;
    uStack_2db0 = 0;
    local_2de8 = 0;
    uStack_2de0 = 0;
    uStack_2dd8 = 0;
    uStack_2dd0 = 0;
    local_2e08 = 0;
    uStack_2e00 = 0;
    uStack_2df8 = 0;
    uStack_2df0 = 0;
    local_2e28 = 0;
    uStack_2e20 = 0;
    uStack_2e18 = 0;
    uStack_2e10 = 0;
    local_2e48 = 0;
    uStack_2e40 = 0;
    uStack_2e38 = 0;
    uStack_2e30 = 0;
    local_2e68 = 0;
    uStack_2e60 = 0;
    uStack_2e58 = 0;
    uStack_2e50 = 0;
    local_2e88 = 0;
    uStack_2e80 = 0;
    uStack_2e78 = 0;
    uStack_2e70 = 0;
    __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_32a0,&local_3258,nthreads);
    __blanczos_matrix::sparse::multiply_transpose(&local_3108,&local_31b8,&local_32a0,nthreads);
    if ((long)local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      memmove(local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start,
              local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start,
              (long)local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    }
    __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_32a0,&local_32b8,nthreads);
    __blanczos_matrix::sparse::multiply_transpose(&local_3108,&local_3240,&local_32a0,nthreads);
    memset(&local_2d80,0,0x200);
    lVar17 = (long)local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    uVar20 = lVar17 + (ulong)(lVar17 == 0) + 3 & 0xfffffffffffffffc;
    auVar48 = vpbroadcastq_avx512vl();
    auVar41 = vpmovsxbq_avx(ZEXT216(0x4000));
    do {
      uVar81 = auVar41._0_8_;
      auVar56._8_8_ = uVar81;
      auVar56._0_8_ = uVar81;
      auVar56._16_8_ = uVar81;
      auVar56._24_8_ = uVar81;
      if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar31 = 0;
        auVar51 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar92 = auVar14;
          auVar49 = vpbroadcastq_avx512vl();
          auVar49 = vpor_avx2(auVar49,auVar51);
          uVar39 = vpcmpuq_avx512vl(auVar49,auVar48,2);
          uVar39 = uVar39 & 0xf;
          auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                        (local_32b8.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar31));
          bVar5 = (byte)uVar39;
          auVar50._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar49._8_8_;
          auVar50._0_8_ = (ulong)(bVar5 & 1) * auVar49._0_8_;
          auVar50._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar49._16_8_;
          auVar50._24_8_ = (uVar39 >> 3) * auVar49._24_8_;
          auVar49 = vpsllvq_avx2(auVar50,auVar56);
          auVar50 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                        (local_3240.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar31));
          auVar54._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar50._8_8_;
          auVar54._0_8_ = (ulong)(bVar5 & 1) * auVar50._0_8_;
          auVar54._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar50._16_8_;
          auVar54._24_8_ = (uVar39 >> 3) * auVar50._24_8_;
          auVar49 = vpternlogq_avx512vl(auVar54,auVar92._0_32_,auVar49,0x6c);
          uVar31 = uVar31 + 4;
          auVar14 = ZEXT3264(auVar49);
        } while (uVar20 != uVar31);
        auVar51 = vmovdqa64_avx512vl(auVar49);
        auVar40._0_8_ =
             (ulong)(bVar5 & 1) * auVar51._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar92._0_8_;
        bVar38 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar40._8_8_ = (ulong)bVar38 * auVar51._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
        bVar38 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar49._16_8_ = (ulong)bVar38 * auVar51._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
        auVar49._0_16_ = auVar40;
        auVar49._24_8_ =
             (uVar39 >> 3) * auVar51._24_8_ | (ulong)!SUB81(uVar39 >> 3,0) * auVar92._24_8_;
        vpshufd_avx(auVar40 ^ auVar49._16_16_,0xee);
      }
      lVar17 = vpextrq_avx(auVar41,1);
      auVar49 = vpbroadcastq_avx512vl();
      auVar50 = vpbroadcastq_avx512vl();
      uVar31 = 0;
      auVar51 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar102._8_8_ = 1;
      auVar102._0_8_ = 1;
      auVar102._16_8_ = 1;
      auVar102._24_8_ = 1;
      auVar106._8_8_ = 4;
      auVar106._0_8_ = 4;
      auVar106._16_8_ = 4;
      auVar106._24_8_ = 4;
      do {
        uVar39 = vpcmpuq_avx512vl(auVar51,auVar49,2);
        uVar39 = uVar39 & 0xf;
        auVar54 = vpaddq_avx2(auVar51,auVar56);
        auVar54 = vpsllvq_avx2(auVar102,auVar54);
        auVar52 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_2d80._M_elems + uVar31));
        auVar53._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar52._8_8_;
        auVar53._0_8_ = (ulong)((byte)uVar39 & 1) * auVar52._0_8_;
        auVar53._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar52._16_8_;
        auVar53._24_8_ = (uVar39 >> 3) * auVar52._24_8_;
        auVar54 = vpternlogq_avx512vl(auVar53,auVar54,auVar50,0xf8);
        auVar54 = vmovdqu64_avx512vl(auVar54);
        *(undefined1 (*) [32])(local_2d80._M_elems + uVar31) = auVar54;
        uVar31 = uVar31 + 4;
        auVar51 = vpaddq_avx2(auVar106,auVar51);
      } while ((lVar17 + 3U & 0xfffffffffffffffc) != uVar31);
      auVar41 = vpaddq_avx(auVar41,_DAT_00109080);
    } while (auVar41._0_8_ != 0x40);
    lVar17 = 1;
    lVar36 = 0x42;
    puVar37 = local_2d80._M_elems;
    do {
      puVar37 = puVar37 + 1;
      if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        auVar51 = vpbroadcastq_avx512vl();
        uVar31 = 0;
        auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar14 = ZEXT1664((undefined1  [16])0x0);
        do {
          auVar92 = auVar14;
          auVar49 = vpbroadcastq_avx512vl();
          auVar49 = vpor_avx2(auVar49,auVar56);
          uVar39 = vpcmpuq_avx512vl(auVar49,auVar48,2);
          uVar39 = uVar39 & 0xf;
          auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                        (local_32b8.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar31));
          bVar5 = (byte)uVar39;
          auVar52._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar49._8_8_;
          auVar52._0_8_ = (ulong)(bVar5 & 1) * auVar49._0_8_;
          auVar52._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar49._16_8_;
          auVar52._24_8_ = (uVar39 >> 3) * auVar49._24_8_;
          auVar49 = vpsrlvq_avx2(auVar52,auVar51);
          auVar50 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                        (local_3240.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start + uVar31));
          auVar55._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar50._8_8_;
          auVar55._0_8_ = (ulong)(bVar5 & 1) * auVar50._0_8_;
          auVar55._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar50._16_8_;
          auVar55._24_8_ = (uVar39 >> 3) * auVar50._24_8_;
          auVar49 = vpternlogq_avx512vl(auVar55,auVar92._0_32_,auVar49,0x6c);
          uVar31 = uVar31 + 4;
          auVar14 = ZEXT3264(auVar49);
        } while (uVar20 != uVar31);
        auVar56 = vmovdqa64_avx512vl(auVar49);
        auVar41._0_8_ =
             (ulong)(bVar5 & 1) * auVar56._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar92._0_8_;
        bVar38 = (bool)((byte)(uVar39 >> 1) & 1);
        auVar41._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
        bVar38 = (bool)((byte)(uVar39 >> 2) & 1);
        auVar51._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
        auVar51._0_16_ = auVar41;
        auVar51._24_8_ =
             (uVar39 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar39 >> 3,0) * auVar92._24_8_;
        vpshufd_avx(auVar41 ^ auVar51._16_16_,0xee);
      }
      auVar51 = vpbroadcastq_avx512vl();
      auVar49 = vpbroadcastq_avx512vl();
      uVar31 = 0;
      auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar94._8_8_ = 1;
      auVar94._0_8_ = 1;
      auVar94._16_8_ = 1;
      auVar94._24_8_ = 1;
      auVar98._8_8_ = 4;
      auVar98._0_8_ = 4;
      auVar98._16_8_ = 4;
      auVar98._24_8_ = 4;
      do {
        uVar39 = vpcmpuq_avx512vl(auVar56,auVar51,2);
        uVar39 = uVar39 & 0xf;
        auVar50 = vpsllvq_avx2(auVar94,auVar56);
        auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar37 + uVar31));
        auVar57._8_8_ = (ulong)((byte)(uVar39 >> 1) & 1) * auVar54._8_8_;
        auVar57._0_8_ = (ulong)((byte)uVar39 & 1) * auVar54._0_8_;
        auVar57._16_8_ = (ulong)((byte)(uVar39 >> 2) & 1) * auVar54._16_8_;
        auVar57._24_8_ = (uVar39 >> 3) * auVar54._24_8_;
        auVar50 = vpternlogq_avx512vl(auVar57,auVar50,auVar49,0xf8);
        auVar50 = vmovdqu64_avx512vl(auVar50);
        *(undefined1 (*) [32])((long)puVar37 + uVar31) = auVar50;
        auVar56 = vpaddq_avx2(auVar56,auVar98);
        uVar31 = uVar31 + 0x20;
      } while ((lVar36 * 8 & 0xffffffffffffffe0U) != uVar31);
      lVar17 = lVar17 + 1;
      lVar36 = lVar36 + -1;
    } while (lVar17 != 0x40);
    uVar20 = 0xffffffffffffffff;
    do {
      if (local_2d80._M_elems[0] == 0) {
        lVar17 = 8;
LAB_00104d4a:
        if (lVar17 != 0x200) goto code_r0x00104d56;
        __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_32a0,&local_3258,nthreads);
        __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_3180,&local_32b8,nthreads);
        puVar12 = local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        puVar22 = local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        uVar31 = (long)local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        local_3208 = local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        local_3200 = local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        uVar39 = (long)local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar20 = uVar39;
        if (uVar39 < uVar31) {
          uVar20 = uVar31;
        }
        local_3198.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start._0_1_ = 0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_3270,uVar20 << 7,(value_type_conflict3 *)&local_3198,
                   (allocator_type *)&local_31a0);
        local_32c0 = operator_new(0x4000);
        memset(local_32c0,0,0x4000);
        lVar17 = 0;
        uVar20 = 0;
        do {
          if (puVar12 != puVar22) {
            uVar27 = uVar20 - 0x40;
            if (uVar20 < 0x40) {
              uVar27 = uVar20;
            }
            uVar28 = 0;
            do {
              pvVar33 = &local_3180;
              if (uVar20 < 0x40) {
                pvVar33 = &local_32a0;
              }
              local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar28 + lVar17] =
                   ((pvVar33->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar28] >> (uVar27 & 0x3f) & 1) != 0;
              uVar28 = uVar28 + 1;
            } while ((uVar28 & 0xffffffff) < uVar31);
          }
          *(undefined1 *)((long)local_32c0 + uVar20 * 0x81) = 1;
          uVar20 = uVar20 + 1;
          lVar17 = lVar17 + uVar31;
        } while (uVar20 != 0x80);
        if (puVar12 == puVar22) {
          uVar16 = 0;
        }
        else {
          uVar20 = 0;
          local_3168._0_4_ = 1;
          uVar27 = 0;
          do {
            uVar23 = (uint)uVar27;
            uVar16 = uVar23;
            if (uVar23 < 0x80) {
              puVar29 = local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar31 * uVar27 + uVar20;
              uVar28 = uVar27;
              do {
                uVar16 = (uint)uVar28;
                if (*puVar29 != '\0') goto LAB_00105e32;
                uVar28 = uVar28 + 1;
                puVar29 = puVar29 + uVar31;
              } while ((int)uVar28 != 0x80);
              uVar16 = 0x80;
            }
LAB_00105e32:
            if (uVar16 != 0x80) {
              if (uVar16 != uVar23) {
                if (uVar20 < uVar31) {
                  uVar28 = uVar20;
                  uVar34 = local_3168._0_4_;
                  do {
                    uVar24 = (ulong)uVar34;
                    uVar2 = local_3270.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar28 + uVar27 * uVar31];
                    local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar28 + uVar27 * uVar31] =
                         local_3270.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar28 + uVar16 * uVar31];
                    local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar28 + uVar16 * uVar31] = uVar2;
                    uVar34 = uVar34 + 1;
                    uVar28 = uVar24;
                  } while (uVar24 < uVar31);
                }
                lVar17 = 0;
                do {
                  uVar3 = *(undefined1 *)((long)local_32c0 + lVar17 + (ulong)(uVar23 << 7));
                  *(undefined1 *)((long)local_32c0 + lVar17 + (ulong)(uVar23 << 7)) =
                       *(undefined1 *)((long)local_32c0 + lVar17 + (ulong)(uVar16 << 7));
                  *(undefined1 *)((long)local_32c0 + lVar17 + (ulong)(uVar16 << 7)) = uVar3;
                  lVar17 = lVar17 + 1;
                } while (lVar17 != 0x80);
              }
              uVar16 = uVar23 + 1;
              if (uVar16 < 0x80) {
                uVar28 = (ulong)uVar16;
                pvVar35 = (void *)(uVar28 * 0x80 + (long)local_32c0);
                do {
                  uVar24 = uVar20;
                  uVar34 = local_3168._0_4_;
                  if (local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar20 + uVar28 * uVar31] != '\0') {
                    while (uVar24 < uVar31) {
                      local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar24 + uVar28 * uVar31] =
                           local_3270.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar24 + uVar28 * uVar31] ^
                           local_3270.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start[uVar24 + uVar27 * uVar31];
                      uVar24 = (ulong)uVar34;
                      uVar34 = uVar34 + 1;
                    }
                    lVar17 = 0;
                    do {
                      *(byte *)((long)pvVar35 + lVar17) =
                           *(byte *)((long)pvVar35 + lVar17) ^
                           *(byte *)((long)local_32c0 + lVar17 + (ulong)(uVar23 << 7));
                      lVar17 = lVar17 + 1;
                    } while (lVar17 != 0x80);
                  }
                  uVar28 = uVar28 + 1;
                  pvVar35 = (void *)((long)pvVar35 + 0x80);
                } while ((int)uVar28 != 0x80);
              }
              uVar27 = (ulong)uVar16;
            }
            uVar16 = (uint)uVar27;
            uVar20 = uVar20 + 1;
            local_3168._0_4_ = local_3168._0_4_ + 1;
          } while ((uVar20 & 0xffffffff) < uVar31);
        }
        if (local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,0,
                 (long)local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
        }
        if (uVar16 < 0x80) {
          uVar20 = (ulong)uVar16;
          lVar17 = uVar39 * uVar20;
          do {
            uVar31 = 0;
            do {
              if ((local_3208 != local_3200) &&
                 (*(char *)((long)local_32c0 + uVar31 + uVar20 * 0x80) != '\0')) {
                uVar27 = uVar31 - 0x40;
                if (uVar31 < 0x40) {
                  uVar27 = uVar31;
                }
                uVar28 = 0;
                do {
                  pvVar33 = &local_32b8;
                  if (uVar31 < 0x40) {
                    pvVar33 = &local_3258;
                  }
                  local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar28 + lVar17] =
                       local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar28 + lVar17] ^
                       ((pvVar33->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start[uVar28] >> (uVar27 & 0x3f) & 1) !=
                       0;
                  uVar28 = uVar28 + 1;
                } while ((uVar28 & 0xffffffff) < uVar39);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != 0x80);
            uVar20 = uVar20 + 1;
            lVar17 = lVar17 + uVar39;
          } while (uVar20 != 0x80);
        }
        local_31a0 = 0;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&local_3198,uVar39,&local_31a0,&local_32c1);
        lVar17 = 0;
        uVar20 = 0;
        puVar29 = local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          if (local_3208 == local_3200) {
LAB_0010608d:
            bVar38 = false;
          }
          else {
            uVar31 = 1;
            uVar27 = 0;
            while (uVar28 = uVar31,
                  local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar27 + lVar17 * uVar39] == '\0') {
              uVar31 = (ulong)((int)uVar28 + 1);
              uVar27 = uVar28;
              if (uVar39 <= uVar28) goto LAB_0010608d;
            }
            bVar38 = (uint)uVar20 < 0x40;
          }
          if (bVar38) {
            if (local_3208 != local_3200) {
              uVar31 = 0;
              do {
                puVar21 = (ulong *)(CONCAT71(local_3198.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                             local_3198.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                   uVar31 * 8);
                *puVar21 = *puVar21 | (ulong)puVar29[uVar31] << (uVar20 & 0x3f);
                uVar31 = uVar31 + 1;
              } while ((uVar31 & 0xffffffff) < uVar39);
            }
            uVar20 = (ulong)((uint)uVar20 + 1);
          }
          lVar17 = lVar17 + 1;
          puVar29 = puVar29 + uVar39;
        } while (lVar17 != 0x80);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Returning ",10);
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," of ",4);
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar19," non-zero nullspace vectors retrieved within ",0x2d);
        poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)poVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar19," candidates.",0xc);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
        std::ostream::put((char)poVar19);
        std::ostream::flush();
        local_3140 = (uint32_t)uVar20;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_3138,&local_3198);
        pvVar35 = (void *)CONCAT71(local_3198.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   local_3198.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start._0_1_);
        if (pvVar35 != (void *)0x0) {
          operator_delete(pvVar35,(long)local_3198.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)pvVar35);
        }
        operator_delete(local_32c0,0x4000);
        if (local_3270.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3270.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3270.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3270.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_32a0,&local_3138,nthreads);
        uVar25 = local_3140;
        bVar38 = local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar38) {
          uVar4 = *local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          puVar22 = local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (uVar4 != 0) goto LAB_00106489;
            puVar22 = puVar22 + 1;
            bVar38 = puVar22 ==
                     local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (bVar38) break;
            uVar4 = *puVar22;
          }
        }
        if (!bVar38) {
LAB_00106489:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"The nullspace is incorrect.",0x1b);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          exit(0xd);
        }
        if (local_31d8 != 0) {
          uVar20 = 0;
          do {
            if ((ulong)local_3108.colmap.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar20] == 0xffffffff) {
              uVar30 = 0;
            }
            else {
              uVar30 = local_3138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start
                       [local_3108.colmap.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar20]];
            }
            local_3120[uVar20] = uVar30;
            uVar20 = uVar20 + 1;
          } while (local_31d8 != uVar20);
        }
        if (local_3138.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3138.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_3138.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_3138.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        goto LAB_001062bd;
      }
LAB_00104d65:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Lanczos iteration ",0x12);
      poVar19 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar19 + -0x18) + (char)poVar19);
      std::ostream::put((char)poVar19);
      std::ostream::flush();
      uVar16 = 0x3f;
      uVar31 = 0;
      uVar23 = 0;
      do {
        bVar38 = (1L << (uVar31 & 0x3f) & uVar20) == 0;
        uVar34 = uVar23;
        if (!bVar38) {
          uVar34 = uVar16;
        }
        uVar16 = uVar16 - !bVar38;
        uVar23 = uVar23 + bVar38;
        *(int *)((long)&local_2e88 + (ulong)uVar34 * 4) = (int)uVar31;
        uVar31 = uVar31 + 1;
      } while (uVar31 != 0x40);
      memcpy(&local_3088,&local_2d80,0x200);
      lVar17 = 0;
      auVar48 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar82._8_8_ = 1;
      auVar82._0_8_ = 1;
      auVar82._16_8_ = 1;
      auVar82._24_8_ = 1;
      auVar88._8_8_ = 4;
      auVar88._0_8_ = 4;
      auVar88._16_8_ = 4;
      auVar88._24_8_ = 4;
      do {
        auVar56 = vpsllvq_avx2(auVar82,auVar48);
        *(undefined1 (*) [32])(local_2b80._M_elems + lVar17) = auVar56;
        lVar17 = lVar17 + 4;
        auVar48 = vpaddq_avx2(auVar48,auVar88);
      } while (lVar17 != 0x40);
      uVar31 = 0;
      uVar39 = 0;
      do {
        uVar28 = (ulong)*(uint *)((long)&local_2e88 + uVar31 * 4);
        uVar24 = 1L << (uVar28 & 0x3f);
        uVar27 = uVar31;
        do {
          if ((local_3088._M_elems[*(uint *)((long)&local_2e88 + uVar27 * 4)] & uVar24) != 0)
          goto LAB_00104e81;
          uVar27 = uVar27 + 1;
        } while (uVar27 != 0x40);
        uVar27 = 0x40;
LAB_00104e81:
        uVar32 = uVar31;
        if ((int)uVar27 == 0x40) {
          do {
            if ((local_2b80._M_elems[*(uint *)((long)&local_2e88 + uVar32 * 4)] & uVar24) != 0)
            goto LAB_00104eac;
            uVar32 = uVar32 + 1;
          } while (uVar32 != 0x40);
          uVar32 = 0x40;
LAB_00104eac:
          if (uVar31 != (uVar32 & 0xffffffff)) {
            uVar16 = *(uint *)((long)&local_2e88 + (uVar32 & 0xffffffff) * 4);
            uVar4 = local_3088._M_elems[uVar28];
            local_3088._M_elems[uVar28] = local_3088._M_elems[uVar16];
            local_3088._M_elems[uVar16] = uVar4;
            uVar4 = local_2b80._M_elems[uVar28];
            local_2b80._M_elems[uVar28] = local_2b80._M_elems[uVar16];
            local_2b80._M_elems[uVar16] = uVar4;
          }
          uVar27 = 0;
          do {
            if ((uVar28 != uVar27) && (uVar32 = local_2b80._M_elems[uVar27], (uVar32 & uVar24) != 0)
               ) {
              local_3088._M_elems[uVar27] =
                   local_3088._M_elems[uVar27] ^ local_3088._M_elems[uVar28];
              local_2b80._M_elems[uVar27] = uVar32 ^ local_2b80._M_elems[uVar28];
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != 0x40);
          local_3088._M_elems[uVar28] = 0;
          local_2b80._M_elems[uVar28] = 0;
        }
        else {
          if (uVar31 != (uVar27 & 0xffffffff)) {
            uVar16 = *(uint *)((long)&local_2e88 + (uVar27 & 0xffffffff) * 4);
            uVar4 = local_3088._M_elems[uVar28];
            local_3088._M_elems[uVar28] = local_3088._M_elems[uVar16];
            local_3088._M_elems[uVar16] = uVar4;
            uVar4 = local_2b80._M_elems[uVar28];
            local_2b80._M_elems[uVar28] = local_2b80._M_elems[uVar16];
            local_2b80._M_elems[uVar16] = uVar4;
          }
          uVar27 = 0;
          do {
            if ((uVar28 != uVar27) && ((local_3088._M_elems[uVar27] & uVar24) != 0)) {
              local_3088._M_elems[uVar27] =
                   local_3088._M_elems[uVar27] ^ local_3088._M_elems[uVar28];
              local_2b80._M_elems[uVar27] =
                   local_2b80._M_elems[uVar27] ^ local_2b80._M_elems[uVar28];
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != 0x40);
          uVar39 = uVar39 | uVar24;
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != 0x40);
      local_3168 = vpbroadcastq_avx512vl();
      lVar17 = 0;
      auVar48 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar89._8_8_ = 1;
      auVar89._0_8_ = 1;
      auVar89._16_8_ = 1;
      auVar89._24_8_ = 1;
      auVar93._8_8_ = 4;
      auVar93._0_8_ = 4;
      auVar93._16_8_ = 4;
      auVar93._24_8_ = 4;
      do {
        auVar56 = vpsrlvq_avx2(local_3168,auVar48);
        vptestnmq_avx512vl(auVar56,auVar89);
        auVar56 = vmovdqu64_avx512vl(SUB6432(ZEXT1664((undefined1  [16])0x0),0));
        *(undefined1 (*) [32])(local_2b80._M_elems + lVar17) = auVar56;
        lVar17 = lVar17 + 4;
        auVar48 = vpaddq_avx2(auVar48,auVar93);
      } while (lVar17 != 0x40);
      lVar17 = 0;
      do {
        auVar48 = vpand_avx2(local_3168,*(undefined1 (*) [32])(local_2b80._M_elems + lVar17));
        *(undefined1 (*) [32])(local_2b80._M_elems + lVar17) = auVar48;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0x40);
      if ((uVar20 | uVar39) == 0xffffffffffffffff) {
LAB_001050fa:
        memset(&local_3088,0,0x200);
        lVar17 = (long)local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar20 = lVar17 + (ulong)(lVar17 == 0) + 3 & 0xfffffffffffffffc;
        auVar48 = vpbroadcastq_avx512vl();
        auVar41 = vpmovsxbq_avx(ZEXT216(0x4000));
        do {
          uVar81 = auVar41._0_8_;
          auVar83._8_8_ = uVar81;
          auVar83._0_8_ = uVar81;
          auVar83._16_8_ = uVar81;
          auVar83._24_8_ = uVar81;
          if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar31 = 0;
            auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar14 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar92 = auVar14;
              auVar51 = vpbroadcastq_avx512vl();
              auVar51 = vpor_avx2(auVar51,auVar56);
              uVar27 = vpcmpuq_avx512vl(auVar51,auVar48,2);
              uVar27 = uVar27 & 0xf;
              auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_32b8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              bVar5 = (byte)uVar27;
              auVar58._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar51._8_8_;
              auVar58._0_8_ = (ulong)(bVar5 & 1) * auVar51._0_8_;
              auVar58._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar51._16_8_;
              auVar58._24_8_ = (uVar27 >> 3) * auVar51._24_8_;
              auVar51 = vpsllvq_avx2(auVar58,auVar83);
              auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_31b8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              auVar59._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
              auVar59._0_8_ = (ulong)(bVar5 & 1) * auVar49._0_8_;
              auVar59._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
              auVar59._24_8_ = (uVar27 >> 3) * auVar49._24_8_;
              auVar51 = vpternlogq_avx512vl(auVar59,auVar92._0_32_,auVar51,0x6c);
              uVar31 = uVar31 + 4;
              auVar14 = ZEXT3264(auVar51);
            } while (uVar20 != uVar31);
            auVar56 = vmovdqa64_avx512vl(auVar51);
            auVar42._0_8_ =
                 (ulong)(bVar5 & 1) * auVar56._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar92._0_8_;
            bVar38 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar42._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
            bVar38 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar60._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
            auVar60._0_16_ = auVar42;
            auVar60._24_8_ =
                 (uVar27 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar27 >> 3,0) * auVar92._24_8_;
            vpshufd_avx(auVar42 ^ auVar60._16_16_,0xee);
          }
          lVar17 = vpextrq_avx(auVar41,1);
          auVar51 = vpbroadcastq_avx512vl();
          auVar49 = vpbroadcastq_avx512vl();
          uVar31 = 0;
          auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar103._8_8_ = 1;
          auVar103._0_8_ = 1;
          auVar103._16_8_ = 1;
          auVar103._24_8_ = 1;
          auVar107._8_8_ = 4;
          auVar107._0_8_ = 4;
          auVar107._16_8_ = 4;
          auVar107._24_8_ = 4;
          do {
            uVar27 = vpcmpuq_avx512vl(auVar56,auVar51,2);
            uVar27 = uVar27 & 0xf;
            auVar50 = vpaddq_avx2(auVar56,auVar83);
            auVar50 = vpsllvq_avx2(auVar103,auVar50);
            auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_3088._M_elems + uVar31));
            auVar61._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar54._8_8_;
            auVar61._0_8_ = (ulong)((byte)uVar27 & 1) * auVar54._0_8_;
            auVar61._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar54._16_8_;
            auVar61._24_8_ = (uVar27 >> 3) * auVar54._24_8_;
            auVar50 = vpternlogq_avx512vl(auVar61,auVar50,auVar49,0xf8);
            auVar50 = vmovdqu64_avx512vl(auVar50);
            *(undefined1 (*) [32])(local_3088._M_elems + uVar31) = auVar50;
            uVar31 = uVar31 + 4;
            auVar56 = vpaddq_avx2(auVar107,auVar56);
          } while ((lVar17 + 3U & 0xfffffffffffffffc) != uVar31);
          auVar41 = vpaddq_avx(auVar41,_DAT_00109080);
        } while (auVar41._0_8_ != 0x40);
        lVar17 = 1;
        lVar36 = 0x42;
        puVar37 = local_3088._M_elems;
        do {
          puVar37 = puVar37 + 1;
          if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            auVar51 = vpbroadcastq_avx512vl();
            uVar31 = 0;
            auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar14 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar92 = auVar14;
              auVar49 = vpbroadcastq_avx512vl();
              auVar49 = vpor_avx2(auVar49,auVar56);
              uVar27 = vpcmpuq_avx512vl(auVar49,auVar48,2);
              uVar27 = uVar27 & 0xf;
              auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_32b8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              bVar5 = (byte)uVar27;
              auVar62._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
              auVar62._0_8_ = (ulong)(bVar5 & 1) * auVar49._0_8_;
              auVar62._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
              auVar62._24_8_ = (uVar27 >> 3) * auVar49._24_8_;
              auVar49 = vpsrlvq_avx2(auVar62,auVar51);
              auVar50 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_31b8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              auVar63._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar50._8_8_;
              auVar63._0_8_ = (ulong)(bVar5 & 1) * auVar50._0_8_;
              auVar63._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar50._16_8_;
              auVar63._24_8_ = (uVar27 >> 3) * auVar50._24_8_;
              auVar49 = vpternlogq_avx512vl(auVar63,auVar92._0_32_,auVar49,0x6c);
              uVar31 = uVar31 + 4;
              auVar14 = ZEXT3264(auVar49);
            } while (uVar20 != uVar31);
            auVar56 = vmovdqa64_avx512vl(auVar49);
            auVar43._0_8_ =
                 (ulong)(bVar5 & 1) * auVar56._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar92._0_8_;
            bVar38 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar43._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
            bVar38 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar64._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
            auVar64._0_16_ = auVar43;
            auVar64._24_8_ =
                 (uVar27 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar27 >> 3,0) * auVar92._24_8_;
            vpshufd_avx(auVar43 ^ auVar64._16_16_,0xee);
          }
          auVar51 = vpbroadcastq_avx512vl();
          auVar49 = vpbroadcastq_avx512vl();
          uVar31 = 0;
          auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar95._8_8_ = 1;
          auVar95._0_8_ = 1;
          auVar95._16_8_ = 1;
          auVar95._24_8_ = 1;
          auVar99._8_8_ = 4;
          auVar99._0_8_ = 4;
          auVar99._16_8_ = 4;
          auVar99._24_8_ = 4;
          do {
            uVar27 = vpcmpuq_avx512vl(auVar56,auVar51,2);
            uVar27 = uVar27 & 0xf;
            auVar50 = vpsllvq_avx2(auVar95,auVar56);
            auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar37 + uVar31));
            auVar65._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar54._8_8_;
            auVar65._0_8_ = (ulong)((byte)uVar27 & 1) * auVar54._0_8_;
            auVar65._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar54._16_8_;
            auVar65._24_8_ = (uVar27 >> 3) * auVar54._24_8_;
            auVar50 = vpternlogq_avx512vl(auVar65,auVar50,auVar49,0xf8);
            auVar50 = vmovdqu64_avx512vl(auVar50);
            *(undefined1 (*) [32])((long)puVar37 + uVar31) = auVar50;
            auVar56 = vpaddq_avx2(auVar56,auVar99);
            uVar31 = uVar31 + 0x20;
          } while ((lVar36 * 8 & 0xffffffffffffffe0U) != uVar31);
          lVar17 = lVar17 + 1;
          lVar36 = lVar36 + -1;
        } while (lVar17 != 0x40);
        (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>
                  (&local_2b80,&local_3088,&local_2980);
        (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  (&local_32b8,&local_2980,&local_3288);
        if ((long)local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar17 = (long)local_3258.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_3258.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar36 = 0;
          do {
            local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar36] =
                 local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36] ^
                 local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar36);
        }
        (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>
                  (&local_2580,&local_2780,&local_3088);
        lVar17 = 0;
        auVar48 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar84._8_8_ = 1;
        auVar84._0_8_ = 1;
        auVar84._16_8_ = 1;
        auVar84._24_8_ = 1;
        auVar90._8_8_ = 4;
        auVar90._0_8_ = 4;
        auVar90._16_8_ = 4;
        auVar90._24_8_ = 4;
        do {
          auVar56 = vpsllvq_avx2(auVar84,auVar48);
          *(undefined1 (*) [32])(local_3088._M_elems + lVar17) =
               auVar56 ^ *(undefined1 (*) [32])(local_3088._M_elems + lVar17);
          lVar17 = lVar17 + 4;
          auVar48 = vpaddq_avx2(auVar48,auVar90);
        } while (lVar17 != 0x40);
        (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>
                  (&local_1f80,&local_3088,&local_2980);
        (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>
                  (&local_2980,&local_2180,&local_2380);
        lVar17 = 0;
        do {
          auVar48 = vpand_avx2(local_3168,*(undefined1 (*) [32])(local_2380._M_elems + lVar17));
          *(undefined1 (*) [32])(local_2380._M_elems + lVar17) = auVar48;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>
                  (&local_2780,&local_2d80,&local_2980);
        lVar17 = 0;
        do {
          auVar48 = vpand_avx2(local_3168,*(undefined1 (*) [32])(local_2980._M_elems + lVar17));
          *(undefined1 (*) [32])(local_2980._M_elems + lVar17) = auVar48;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        memset(&local_3088,0,0x200);
        puVar12 = local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        puVar22 = local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar17 = (long)local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar20 = lVar17 + (ulong)(lVar17 == 0) + 3 & 0xfffffffffffffffc;
        auVar48 = vpbroadcastq_avx512vl();
        auVar41 = vpmovsxbq_avx(ZEXT216(0x4000));
        do {
          uVar81 = auVar41._0_8_;
          auVar85._8_8_ = uVar81;
          auVar85._0_8_ = uVar81;
          auVar85._16_8_ = uVar81;
          auVar85._24_8_ = uVar81;
          if (local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar31 = 0;
            auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar14 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar92 = auVar14;
              auVar51 = vpbroadcastq_avx512vl();
              auVar51 = vpor_avx2(auVar51,auVar56);
              uVar27 = vpcmpuq_avx512vl(auVar51,auVar48,2);
              uVar27 = uVar27 & 0xf;
              auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_3240.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              auVar66._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar51._8_8_;
              auVar66._0_8_ = (ulong)((byte)uVar27 & 1) * auVar51._0_8_;
              auVar66._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar51._16_8_;
              auVar66._24_8_ = (uVar27 >> 3) * auVar51._24_8_;
              auVar51 = vpsllvq_avx2(auVar66,auVar85);
              auVar51 = vpternlogq_avx512vl(auVar51,auVar92._0_32_,auVar66,0x6c);
              uVar31 = uVar31 + 4;
              auVar14 = ZEXT3264(auVar51);
            } while (uVar20 != uVar31);
            auVar56 = vmovdqa64_avx512vl(auVar51);
            bVar38 = (bool)((byte)uVar27 & 1);
            auVar44._0_8_ = (ulong)bVar38 * auVar56._0_8_ | (ulong)!bVar38 * auVar92._0_8_;
            bVar38 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar44._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
            bVar38 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar67._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
            auVar67._0_16_ = auVar44;
            auVar67._24_8_ =
                 (uVar27 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar27 >> 3,0) * auVar92._24_8_;
            vpshufd_avx(auVar44 ^ auVar67._16_16_,0xee);
          }
          lVar17 = vpextrq_avx(auVar41,1);
          auVar51 = vpbroadcastq_avx512vl();
          auVar49 = vpbroadcastq_avx512vl();
          uVar31 = 0;
          auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar104._8_8_ = 1;
          auVar104._0_8_ = 1;
          auVar104._16_8_ = 1;
          auVar104._24_8_ = 1;
          auVar108._8_8_ = 4;
          auVar108._0_8_ = 4;
          auVar108._16_8_ = 4;
          auVar108._24_8_ = 4;
          do {
            uVar27 = vpcmpuq_avx512vl(auVar56,auVar51,2);
            uVar27 = uVar27 & 0xf;
            auVar50 = vpaddq_avx2(auVar56,auVar85);
            auVar50 = vpsllvq_avx2(auVar104,auVar50);
            auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_3088._M_elems + uVar31));
            auVar68._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar54._8_8_;
            auVar68._0_8_ = (ulong)((byte)uVar27 & 1) * auVar54._0_8_;
            auVar68._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar54._16_8_;
            auVar68._24_8_ = (uVar27 >> 3) * auVar54._24_8_;
            auVar50 = vpternlogq_avx512vl(auVar68,auVar50,auVar49,0xf8);
            auVar50 = vmovdqu64_avx512vl(auVar50);
            *(undefined1 (*) [32])(local_3088._M_elems + uVar31) = auVar50;
            uVar31 = uVar31 + 4;
            auVar56 = vpaddq_avx2(auVar108,auVar56);
          } while ((lVar17 + 3U & 0xfffffffffffffffc) != uVar31);
          auVar41 = vpaddq_avx(auVar41,_DAT_00109080);
        } while (auVar41._0_8_ != 0x40);
        lVar17 = 1;
        lVar36 = 0x42;
        puVar37 = local_3088._M_elems;
        do {
          puVar37 = puVar37 + 1;
          if (local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            auVar51 = vpbroadcastq_avx512vl();
            uVar31 = 0;
            auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar14 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar92 = auVar14;
              auVar49 = vpbroadcastq_avx512vl();
              auVar49 = vpor_avx2(auVar49,auVar56);
              uVar27 = vpcmpuq_avx512vl(auVar49,auVar48,2);
              uVar27 = uVar27 & 0xf;
              auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_3240.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              auVar69._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
              auVar69._0_8_ = (ulong)((byte)uVar27 & 1) * auVar49._0_8_;
              auVar69._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
              auVar69._24_8_ = (uVar27 >> 3) * auVar49._24_8_;
              auVar49 = vpsrlvq_avx2(auVar69,auVar51);
              auVar49 = vpternlogq_avx512vl(auVar49,auVar92._0_32_,auVar69,0x6c);
              uVar31 = uVar31 + 4;
              auVar14 = ZEXT3264(auVar49);
            } while (uVar20 != uVar31);
            auVar56 = vmovdqa64_avx512vl(auVar49);
            bVar38 = (bool)((byte)uVar27 & 1);
            auVar45._0_8_ = (ulong)bVar38 * auVar56._0_8_ | (ulong)!bVar38 * auVar92._0_8_;
            bVar38 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar45._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
            bVar38 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar70._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
            auVar70._0_16_ = auVar45;
            auVar70._24_8_ =
                 (uVar27 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar27 >> 3,0) * auVar92._24_8_;
            vpshufd_avx(auVar45 ^ auVar70._16_16_,0xee);
          }
          auVar51 = vpbroadcastq_avx512vl();
          auVar49 = vpbroadcastq_avx512vl();
          uVar31 = 0;
          auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar96._8_8_ = 1;
          auVar96._0_8_ = 1;
          auVar96._16_8_ = 1;
          auVar96._24_8_ = 1;
          auVar100._8_8_ = 4;
          auVar100._0_8_ = 4;
          auVar100._16_8_ = 4;
          auVar100._24_8_ = 4;
          do {
            uVar27 = vpcmpuq_avx512vl(auVar56,auVar51,2);
            uVar27 = uVar27 & 0xf;
            auVar50 = vpsllvq_avx2(auVar96,auVar56);
            auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar37 + uVar31));
            auVar71._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar54._8_8_;
            auVar71._0_8_ = (ulong)((byte)uVar27 & 1) * auVar54._0_8_;
            auVar71._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar54._16_8_;
            auVar71._24_8_ = (uVar27 >> 3) * auVar54._24_8_;
            auVar50 = vpternlogq_avx512vl(auVar71,auVar50,auVar49,0xf8);
            auVar50 = vmovdqu64_avx512vl(auVar50);
            *(undefined1 (*) [32])((long)puVar37 + uVar31) = auVar50;
            auVar56 = vpaddq_avx2(auVar56,auVar100);
            uVar31 = uVar31 + 0x20;
          } while ((lVar36 * 8 & 0xffffffffffffffe0U) != uVar31);
          lVar17 = lVar17 + 1;
          lVar36 = lVar36 + -1;
        } while (lVar17 != 0x40);
        lVar17 = 0;
        do {
          auVar48 = vpand_avx2(local_3168,*(undefined1 (*) [32])(local_3088._M_elems + lVar17));
          *(undefined1 (*) [32])(local_3088._M_elems + lVar17) = auVar48;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        lVar17 = 0;
        do {
          uVar20 = local_2d80._M_elems[lVar17 + 1];
          uVar31 = local_2d80._M_elems[lVar17 + 2];
          uVar27 = local_2d80._M_elems[lVar17 + 3];
          uVar28 = local_3088._M_elems[lVar17 + 1];
          uVar24 = local_3088._M_elems[lVar17 + 2];
          uVar32 = local_3088._M_elems[lVar17 + 3];
          local_2180._M_elems[lVar17] = local_2d80._M_elems[lVar17] ^ local_3088._M_elems[lVar17];
          local_2180._M_elems[lVar17 + 1] = uVar20 ^ uVar28;
          local_2180._M_elems[lVar17 + 2] = uVar31 ^ uVar24;
          local_2180._M_elems[lVar17 + 3] = uVar27 ^ uVar32;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        (anonymous_namespace)::mul<std::array<unsigned_long,64ul>>
                  (&local_2b80,&local_2180,&local_3088);
        lVar17 = 0;
        auVar48 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        auVar86._8_8_ = 1;
        auVar86._0_8_ = 1;
        auVar86._16_8_ = 1;
        auVar86._24_8_ = 1;
        auVar91._8_8_ = 4;
        auVar91._0_8_ = 4;
        auVar91._16_8_ = 4;
        auVar91._24_8_ = 4;
        do {
          auVar56 = vpsllvq_avx2(auVar86,auVar48);
          *(undefined1 (*) [32])(local_3088._M_elems + lVar17) =
               auVar56 ^ *(undefined1 (*) [32])(local_3088._M_elems + lVar17);
          lVar17 = lVar17 + 4;
          auVar48 = vpaddq_avx2(auVar48,auVar91);
        } while (lVar17 != 0x40);
        auVar48 = vpmovsxbq_avx2(ZEXT416(0x3020100));
        if ((long)puVar12 - (long)puVar22 != 0) {
          auVar56 = vpbroadcastq_avx512vl();
          auVar56 = vpsrlq_avx2(auVar56,3);
          uVar20 = 0;
          do {
            auVar51 = vpbroadcastq_avx512vl();
            auVar51 = vpor_avx2(auVar51,auVar48);
            uVar31 = vpcmpuq_avx512vl(auVar51,auVar56,2);
            uVar31 = uVar31 & 0xf;
            auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(puVar22 + uVar20));
            auVar72._8_8_ = (ulong)((byte)(uVar31 >> 1) & 1) * auVar51._8_8_;
            auVar72._0_8_ = (ulong)((byte)uVar31 & 1) * auVar51._0_8_;
            auVar72._16_8_ = (ulong)((byte)(uVar31 >> 2) & 1) * auVar51._16_8_;
            auVar72._24_8_ = (uVar31 >> 3) * auVar51._24_8_;
            auVar51 = vpand_avx2(auVar72,local_3168);
            auVar51 = vmovdqu64_avx512vl(auVar51);
            *(undefined1 (*) [32])(puVar22 + uVar20) = auVar51;
            uVar20 = uVar20 + 4;
          } while (((((long)puVar12 - (long)puVar22) - 8U >> 3) + 4 & 0xfffffffffffffffc) != uVar20)
          ;
        }
        (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  (&local_32b8,&local_3088,&local_31d0);
        if ((long)local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar17 = (long)local_3240.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_3240.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar36 = 0;
          do {
            local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar36] =
                 local_31d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36] ^
                 local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar36);
        }
        (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  (&local_3228,&local_2980,&local_31d0);
        if ((long)local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar17 = (long)local_3288.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_3288.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar36 = 0;
          do {
            local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar36] =
                 local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36] ^
                 local_31d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar36);
        }
        (anonymous_namespace)::mul<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                  (&local_31f8,&local_2380,&local_31d0);
        puVar13 = local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar12 = local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        puVar22 = local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((long)local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar17 = (long)local_3288.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_3288.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar36 = 0;
          do {
            local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start[lVar36] =
                 local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36] ^
                 local_31d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar36];
            lVar36 = lVar36 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar36);
        }
        local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start = puVar22;
        local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar12;
        local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = puVar13;
        __blanczos_matrix::sparse::multiply_regular(&local_3108,&local_32a0,&local_32b8,nthreads);
        __blanczos_matrix::sparse::multiply_transpose(&local_3108,&local_3240,&local_32a0,nthreads);
        lVar17 = 0;
        do {
          uVar4 = local_1f80._M_elems[lVar17];
          uVar6 = local_1f80._M_elems[lVar17 + 1];
          uVar7 = local_1f80._M_elems[lVar17 + 2];
          uVar8 = local_1f80._M_elems[lVar17 + 3];
          uVar9 = local_2780._M_elems[lVar17 + 1];
          uVar10 = local_2780._M_elems[lVar17 + 2];
          uVar11 = local_2780._M_elems[lVar17 + 3];
          local_1f80._M_elems[lVar17] = local_2780._M_elems[lVar17];
          local_1f80._M_elems[lVar17 + 1] = uVar9;
          local_1f80._M_elems[lVar17 + 2] = uVar10;
          local_1f80._M_elems[lVar17 + 3] = uVar11;
          local_2780._M_elems[lVar17] = uVar4;
          local_2780._M_elems[lVar17 + 1] = uVar6;
          local_2780._M_elems[lVar17 + 2] = uVar7;
          local_2780._M_elems[lVar17 + 3] = uVar8;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        lVar17 = 0;
        do {
          uVar4 = local_2780._M_elems[lVar17];
          uVar6 = local_2780._M_elems[lVar17 + 1];
          uVar7 = local_2780._M_elems[lVar17 + 2];
          uVar8 = local_2780._M_elems[lVar17 + 3];
          uVar9 = local_2b80._M_elems[lVar17 + 1];
          uVar10 = local_2b80._M_elems[lVar17 + 2];
          uVar11 = local_2b80._M_elems[lVar17 + 3];
          local_2780._M_elems[lVar17] = local_2b80._M_elems[lVar17];
          local_2780._M_elems[lVar17 + 1] = uVar9;
          local_2780._M_elems[lVar17 + 2] = uVar10;
          local_2780._M_elems[lVar17 + 3] = uVar11;
          local_2b80._M_elems[lVar17] = uVar4;
          local_2b80._M_elems[lVar17 + 1] = uVar6;
          local_2b80._M_elems[lVar17 + 2] = uVar7;
          local_2b80._M_elems[lVar17 + 3] = uVar8;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        lVar17 = 0;
        do {
          uVar4 = local_2580._M_elems[lVar17];
          uVar6 = local_2580._M_elems[lVar17 + 1];
          uVar7 = local_2580._M_elems[lVar17 + 2];
          uVar8 = local_2580._M_elems[lVar17 + 3];
          uVar9 = local_2d80._M_elems[lVar17 + 1];
          uVar10 = local_2d80._M_elems[lVar17 + 2];
          uVar11 = local_2d80._M_elems[lVar17 + 3];
          local_2580._M_elems[lVar17] = local_2d80._M_elems[lVar17];
          local_2580._M_elems[lVar17 + 1] = uVar9;
          local_2580._M_elems[lVar17 + 2] = uVar10;
          local_2580._M_elems[lVar17 + 3] = uVar11;
          local_2d80._M_elems[lVar17] = uVar4;
          local_2d80._M_elems[lVar17 + 1] = uVar6;
          local_2d80._M_elems[lVar17 + 2] = uVar7;
          local_2d80._M_elems[lVar17 + 3] = uVar8;
          lVar17 = lVar17 + 4;
        } while (lVar17 != 0x40);
        memset(&local_2d80,0,0x200);
        lVar17 = (long)local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar20 = lVar17 + (ulong)(lVar17 == 0) + 3 & 0xfffffffffffffffc;
        auVar48 = vpbroadcastq_avx512vl();
        auVar41 = vpmovsxbq_avx(ZEXT216(0x4000));
        do {
          uVar81 = auVar41._0_8_;
          auVar87._8_8_ = uVar81;
          auVar87._0_8_ = uVar81;
          auVar87._16_8_ = uVar81;
          auVar87._24_8_ = uVar81;
          if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar31 = 0;
            auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar14 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar92 = auVar14;
              auVar51 = vpbroadcastq_avx512vl();
              auVar51 = vpor_avx2(auVar51,auVar56);
              uVar27 = vpcmpuq_avx512vl(auVar51,auVar48,2);
              uVar27 = uVar27 & 0xf;
              auVar51 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_32b8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              bVar5 = (byte)uVar27;
              auVar73._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar51._8_8_;
              auVar73._0_8_ = (ulong)(bVar5 & 1) * auVar51._0_8_;
              auVar73._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar51._16_8_;
              auVar73._24_8_ = (uVar27 >> 3) * auVar51._24_8_;
              auVar51 = vpsllvq_avx2(auVar73,auVar87);
              auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_3240.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              auVar74._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
              auVar74._0_8_ = (ulong)(bVar5 & 1) * auVar49._0_8_;
              auVar74._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
              auVar74._24_8_ = (uVar27 >> 3) * auVar49._24_8_;
              auVar51 = vpternlogq_avx512vl(auVar74,auVar92._0_32_,auVar51,0x6c);
              uVar31 = uVar31 + 4;
              auVar14 = ZEXT3264(auVar51);
            } while (uVar20 != uVar31);
            auVar56 = vmovdqa64_avx512vl(auVar51);
            auVar46._0_8_ =
                 (ulong)(bVar5 & 1) * auVar56._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar92._0_8_;
            bVar38 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar46._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
            bVar38 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar75._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
            auVar75._0_16_ = auVar46;
            auVar75._24_8_ =
                 (uVar27 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar27 >> 3,0) * auVar92._24_8_;
            vpshufd_avx(auVar46 ^ auVar75._16_16_,0xee);
          }
          lVar17 = vpextrq_avx(auVar41,1);
          auVar51 = vpbroadcastq_avx512vl();
          auVar49 = vpbroadcastq_avx512vl();
          uVar31 = 0;
          auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar105._8_8_ = 1;
          auVar105._0_8_ = 1;
          auVar105._16_8_ = 1;
          auVar105._24_8_ = 1;
          auVar109._8_8_ = 4;
          auVar109._0_8_ = 4;
          auVar109._16_8_ = 4;
          auVar109._24_8_ = 4;
          do {
            uVar27 = vpcmpuq_avx512vl(auVar56,auVar51,2);
            uVar27 = uVar27 & 0xf;
            auVar50 = vpaddq_avx2(auVar56,auVar87);
            auVar50 = vpsllvq_avx2(auVar105,auVar50);
            auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])(local_2d80._M_elems + uVar31));
            auVar76._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar54._8_8_;
            auVar76._0_8_ = (ulong)((byte)uVar27 & 1) * auVar54._0_8_;
            auVar76._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar54._16_8_;
            auVar76._24_8_ = (uVar27 >> 3) * auVar54._24_8_;
            auVar50 = vpternlogq_avx512vl(auVar76,auVar50,auVar49,0xf8);
            auVar50 = vmovdqu64_avx512vl(auVar50);
            *(undefined1 (*) [32])(local_2d80._M_elems + uVar31) = auVar50;
            uVar31 = uVar31 + 4;
            auVar56 = vpaddq_avx2(auVar109,auVar56);
          } while ((lVar17 + 3U & 0xfffffffffffffffc) != uVar31);
          auVar41 = vpaddq_avx(auVar41,_DAT_00109080);
        } while (auVar41._0_8_ != 0x40);
        lVar17 = 1;
        lVar36 = 0x42;
        puVar37 = local_2d80._M_elems;
        do {
          puVar37 = puVar37 + 1;
          if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            auVar51 = vpbroadcastq_avx512vl();
            uVar31 = 0;
            auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
            auVar14 = ZEXT1664((undefined1  [16])0x0);
            do {
              auVar92 = auVar14;
              auVar49 = vpbroadcastq_avx512vl();
              auVar49 = vpor_avx2(auVar49,auVar56);
              uVar27 = vpcmpuq_avx512vl(auVar49,auVar48,2);
              uVar27 = uVar27 & 0xf;
              auVar49 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_32b8.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              bVar5 = (byte)uVar27;
              auVar77._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar49._8_8_;
              auVar77._0_8_ = (ulong)(bVar5 & 1) * auVar49._0_8_;
              auVar77._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar49._16_8_;
              auVar77._24_8_ = (uVar27 >> 3) * auVar49._24_8_;
              auVar49 = vpsrlvq_avx2(auVar77,auVar51);
              auVar50 = vmovdqu64_avx512vl(*(undefined1 (*) [32])
                                            (local_3240.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar31));
              auVar78._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar50._8_8_;
              auVar78._0_8_ = (ulong)(bVar5 & 1) * auVar50._0_8_;
              auVar78._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar50._16_8_;
              auVar78._24_8_ = (uVar27 >> 3) * auVar50._24_8_;
              auVar49 = vpternlogq_avx512vl(auVar78,auVar92._0_32_,auVar49,0x6c);
              uVar31 = uVar31 + 4;
              auVar14 = ZEXT3264(auVar49);
            } while (uVar20 != uVar31);
            auVar56 = vmovdqa64_avx512vl(auVar49);
            auVar47._0_8_ =
                 (ulong)(bVar5 & 1) * auVar56._0_8_ | (ulong)!(bool)(bVar5 & 1) * auVar92._0_8_;
            bVar38 = (bool)((byte)(uVar27 >> 1) & 1);
            auVar47._8_8_ = (ulong)bVar38 * auVar56._8_8_ | (ulong)!bVar38 * auVar92._8_8_;
            bVar38 = (bool)((byte)(uVar27 >> 2) & 1);
            auVar79._16_8_ = (ulong)bVar38 * auVar56._16_8_ | (ulong)!bVar38 * auVar92._16_8_;
            auVar79._0_16_ = auVar47;
            auVar79._24_8_ =
                 (uVar27 >> 3) * auVar56._24_8_ | (ulong)!SUB81(uVar27 >> 3,0) * auVar92._24_8_;
            vpshufd_avx(auVar47 ^ auVar79._16_16_,0xee);
          }
          auVar51 = vpbroadcastq_avx512vl();
          auVar49 = vpbroadcastq_avx512vl();
          uVar31 = 0;
          auVar56 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar97._8_8_ = 1;
          auVar97._0_8_ = 1;
          auVar97._16_8_ = 1;
          auVar97._24_8_ = 1;
          auVar101._8_8_ = 4;
          auVar101._0_8_ = 4;
          auVar101._16_8_ = 4;
          auVar101._24_8_ = 4;
          do {
            uVar27 = vpcmpuq_avx512vl(auVar56,auVar51,2);
            uVar27 = uVar27 & 0xf;
            auVar50 = vpsllvq_avx2(auVar97,auVar56);
            auVar54 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)puVar37 + uVar31));
            auVar80._8_8_ = (ulong)((byte)(uVar27 >> 1) & 1) * auVar54._8_8_;
            auVar80._0_8_ = (ulong)((byte)uVar27 & 1) * auVar54._0_8_;
            auVar80._16_8_ = (ulong)((byte)(uVar27 >> 2) & 1) * auVar54._16_8_;
            auVar80._24_8_ = (uVar27 >> 3) * auVar54._24_8_;
            auVar50 = vpternlogq_avx512vl(auVar80,auVar50,auVar49,0xf8);
            auVar50 = vmovdqu64_avx512vl(auVar50);
            *(undefined1 (*) [32])((long)puVar37 + uVar31) = auVar50;
            auVar56 = vpaddq_avx2(auVar56,auVar101);
            uVar31 = uVar31 + 0x20;
          } while ((lVar36 * 8 & 0xffffffffffffffe0U) != uVar31);
          lVar17 = lVar17 + 1;
          lVar36 = lVar36 + -1;
        } while (lVar17 != 0x40);
        bVar38 = true;
      }
      else {
        bVar38 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (bVar38) {
LAB_001050a2:
          if (bVar38) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "Not all indices in S[i] U S[i-1], but V[i-1] zero for those indices.",0x44);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
            std::ostream::put(-0x38);
            std::ostream::flush();
            goto LAB_001050fa;
          }
        }
        else {
          uVar31 = *local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          puVar21 = local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          while ((uVar31 & ~(uVar20 | uVar39)) == 0) {
            puVar21 = puVar21 + 1;
            bVar38 = puVar21 ==
                     local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            if (bVar38) goto LAB_001050a2;
            uVar31 = *puVar21;
          }
        }
        bVar38 = false;
      }
      uVar20 = uVar39;
    } while (bVar38);
    uVar25 = 0xffffffff;
LAB_001062bd:
    if (local_3180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3180.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3180.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3180.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_32a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_32a0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_32a0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_31d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_31d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_31d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_31d0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_3288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3288.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3288.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3240.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3240.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3240.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_31f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_31f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_31f8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_3228.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3228.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3228.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_32b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_32b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_32b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_31b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_31b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_31b8.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (uVar25 == 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Need to restart Lanczos.",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    if (local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (result_type *)0x0) {
      operator_delete(local_3258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_3258.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_3258.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::random_device::_M_fini();
    if (uVar25 != 0xffffffff) {
      __blanczos_matrix::sparse::~sparse(&local_3108);
      return uVar25;
    }
  } while( true );
code_r0x00104d56:
  plVar1 = (long *)((long)local_2d80._M_elems + lVar17);
  lVar17 = lVar17 + 8;
  if (*plVar1 != 0) goto LAB_00104d65;
  goto LAB_00104d4a;
}

Assistant:

uint32_t blanczos(const uint32_t * B, const uint64_t N, const uint32_t Nrow, const uint32_t Ncol, uint64_t * result)
{
    const uint32_t nthreads = std::max(1U, std::thread::hardware_concurrency());
    constexpr double cache = 512.0 * 1024.0; // Blocks capped at 512 KB.

    if (Ncol < Nrow + 64U)
    {
        std::cerr << "Ncol >= Nrow + 64 is expected." << std::endl;
        exit(17);
    }

    const __blanczos_matrix::sparse matrix = __blanczos_matrix::sparse(B, N, Nrow, Ncol, cache);

    uint32_t Nsol = UINT32_MAX;
    while (Nsol == UINT32_MAX)
    {
        std::random_device rd;
        std::mt19937_64 gen(rd());
        std::uniform_int_distribution<uint64_t> dis(0U, UINT64_MAX);

        vec64 X = vec64(matrix.Kcol(), 0U);
        for (uint64_t & elem : X)
            elem = dis(gen);

        Nsol = runner(matrix, X, result, nthreads);
        if (Nsol == UINT32_MAX)
            std::cout << "Need to restart Lanczos." << std::endl;
    }
    return Nsol;
}